

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O3

void anon_unknown.dwarf_5f7ee::assert_range_equals1(void)

{
  initializer_list<int> __l;
  string expected;
  vector<int,_std::allocator<int>_> v;
  deque<long,_std::allocator<long>_> li;
  Assert local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  vector<int,_std::allocator<int>_> local_e0 [3];
  _Deque_base<long,_std::allocator<long>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x100000000;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0x300000002;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(local_e0,__l,(allocator_type *)&local_108);
  local_f8 = 2;
  uStack_f0 = 4;
  local_108.m_file = (char *)0x0;
  local_108.m_line = 1;
  local_108._12_4_ = 0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::deque<long,std::allocator<long>>::_M_range_initialize<long_const*>
            ((deque<long,std::allocator<long>> *)&local_88,&local_108);
  local_108.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_108.m_line = 0x174;
  UnitTests::Assert::
  RangeEquals<std::deque<long,std::allocator<long>>&,std::vector<int,std::allocator<int>>&>
            (&local_108,(deque<long,_std::allocator<long>_> *)&local_88,local_e0);
  std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_88);
  if (local_e0[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(assert_range_equals1)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            std::deque<long> li{0, 1, 2, 4};
            ASSERT_RANGE_EQUALS(li, v);
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg = e.what();

            std::string expected = "error A1000: Assertion failure : Expected range [4] different to actual range [4]\n"
                                   "\telement[0] = (0,0)\n"
                                   "\telement[1] = (1,1)\n"
                                   "\telement[2] = (2,2)\n"
                                   "\telement[3] = (4,3) <--------- HERE\n";

            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_RANGE_EQUALS", __FILE__, __LINE__);
            }
        }
    }